

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O0

int __thiscall CaDiCaL::Internal::trivially_true_satisfiable(Internal *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int *piVar4;
  Internal *in_RDI;
  int idx;
  iterator __end1_1;
  iterator __begin1_1;
  Range *__range1_1;
  char tmp;
  int *lit;
  literal_iterator __end2;
  literal_iterator __begin2;
  Clause *__range2;
  bool found_positive_literal;
  bool satisfied;
  Clause **c;
  iterator __end1;
  iterator __begin1;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *__range1;
  Internal *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  iterator local_70;
  iterator local_6c;
  Range *local_68;
  char local_59;
  int *local_58;
  int *local_50;
  int *local_48;
  Clause *local_40;
  byte local_32;
  byte local_31;
  reference local_30;
  Clause **local_28;
  __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  local_20;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *local_18;
  
  local_18 = &in_RDI->clauses;
  local_20._M_current =
       (Clause **)
       std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin
                 ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_28 = (Clause **)
             std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::end
                       ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (!bVar1) {
      if (in_RDI->internal != (Internal *)0x0) {
        verbose(in_RDI->internal,1,"all clauses contain a positive literal");
      }
      local_68 = &in_RDI->vars;
      local_6c = Range::begin((Range *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                             );
      local_70 = Range::end((Range *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      while( true ) {
        bVar1 = CaDiCaL::operator!=(&local_6c,&local_70);
        if (!bVar1) {
          (in_RDI->stats).lucky.constant.one = (in_RDI->stats).lucky.constant.one + 1;
          return 10;
        }
        piVar4 = Range::iterator::operator*(&local_6c);
        iVar3 = *piVar4;
        bVar1 = terminated_asynchronously
                          ((Internal *)CONCAT44(iVar3,in_stack_ffffffffffffff88),
                           (int)((ulong)in_RDI >> 0x20));
        if (bVar1) break;
        cVar2 = val(in_RDI,iVar3);
        if (cVar2 == '\0') {
          search_assume_decision(in_RDI,in_stack_ffffffffffffff7c);
          bVar1 = propagate(in_stack_000000b0);
          if (!bVar1) {
            iVar3 = unlucky(in_RDI,in_stack_ffffffffffffff7c);
            return iVar3;
          }
        }
        Range::iterator::operator++((iterator *)in_RDI);
      }
      iVar3 = unlucky(in_RDI,in_stack_ffffffffffffff7c);
      return iVar3;
    }
    local_30 = __gnu_cxx::
               __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
               ::operator*(&local_20);
    bVar1 = terminated_asynchronously
                      ((Internal *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (int)((ulong)in_RDI >> 0x20));
    if (bVar1) {
      iVar3 = unlucky(in_RDI,in_stack_ffffffffffffff7c);
      return iVar3;
    }
    if (((*(uint *)&(*local_30)->field_0x8 >> 4 & 1) == 0) &&
       ((*(uint *)&(*local_30)->field_0x8 >> 0xb & 1) == 0)) {
      local_31 = 0;
      local_32 = 0;
      local_40 = *local_30;
      local_48 = Clause::begin(local_40);
      local_50 = Clause::end(local_40);
      for (; local_48 != local_50; local_48 = local_48 + 1) {
        local_58 = local_48;
        local_59 = val(in_RDI,*local_48);
        if ('\0' < local_59) {
          local_31 = 1;
          break;
        }
        if ((-1 < local_59) && (-1 < *local_58)) {
          local_32 = 1;
          break;
        }
      }
      if (((local_31 & 1) == 0) && ((local_32 & 1) == 0)) {
        iVar3 = unlucky(in_RDI,in_stack_ffffffffffffff7c);
        return iVar3;
      }
    }
    __gnu_cxx::
    __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
    ::operator++(&local_20);
  } while( true );
}

Assistant:

int Internal::trivially_true_satisfiable () {
  LOG ("checking that all clauses contain a positive literal");
  assert (!level);
  assert (assumptions.empty ());
  for (const auto &c : clauses) {
    if (terminated_asynchronously (100))
      return unlucky (-1);
    if (c->garbage)
      continue;
    if (c->redundant)
      continue;
    bool satisfied = false, found_positive_literal = false;
    for (const auto &lit : *c) {
      const signed char tmp = val (lit);
      if (tmp > 0) {
        satisfied = true;
        break;
      }
      if (tmp < 0)
        continue;
      if (lit < 0)
        continue;
      found_positive_literal = true;
      break;
    }
    if (satisfied || found_positive_literal)
      continue;
    LOG (c, "found purely negatively");
    return unlucky (0);
  }
  VERBOSE (1, "all clauses contain a positive literal");
  for (auto idx : vars) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (val (idx))
      continue;
    search_assume_decision (idx);
    if (propagate ())
      continue;
    assert (level > 0);
    LOG ("propagation failed including redundant clauses");
    return unlucky (0);
  }
  stats.lucky.constant.one++;
  return 10;
}